

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *pcVar4;
  pointer pcVar5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  long *plVar8;
  TestFactoryBase *factory;
  long *plVar9;
  string message;
  string full_name;
  allocator local_149;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  _func_int **local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  TestFactoryBase *local_128;
  _func_int **local_120;
  TestFactoryBase local_118;
  _func_int **pp_Stack_110;
  int local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  TestFactoryBase *local_e0;
  undefined8 local_d8;
  TestFactoryBase local_d0;
  _func_int **pp_Stack_c8;
  int local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  CodeLocation local_58;
  
  std::operator+(&local_100,"Paramaterized test suite ",name);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_b8 = &local_a8;
  plVar9 = plVar8 + 2;
  if ((long *)*plVar8 == plVar9) {
    local_a8 = *plVar9;
    lStack_a0 = plVar8[3];
  }
  else {
    local_a8 = *plVar9;
    local_b8 = (long *)*plVar8;
  }
  local_b0 = plVar8[1];
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  paVar1 = &local_100.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  std::operator+(&local_100,"UninstantiatedParamaterizedTestSuite<",name);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_98 = &local_88;
  plVar9 = plVar8 + 2;
  if ((long *)*plVar8 == plVar9) {
    local_88 = *plVar9;
    lStack_80 = plVar8[3];
  }
  else {
    local_88 = *plVar9;
    local_98 = (long *)*plVar8;
  }
  local_90 = plVar8[1];
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  plVar8 = local_98;
  pcVar4 = (location->file)._M_dataplus._M_p;
  iVar3 = location->line;
  local_148 = &local_138;
  std::__cxx11::string::_M_construct<char*>((string *)&local_148,local_b8,local_b0 + (long)local_b8)
  ;
  pcVar5 = (location->file)._M_dataplus._M_p;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar5,pcVar5 + (location->file)._M_string_length);
  local_108 = location->line;
  std::__cxx11::string::string((string *)&local_78,pcVar4,&local_149);
  paVar2 = &local_58.file.field_2;
  local_58.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_78 + local_70);
  local_58.line = iVar3;
  factory = (TestFactoryBase *)operator_new(0x50);
  pp_Var7 = local_120;
  pp_Var6 = local_140;
  if (local_148 == &local_138) {
    local_100.field_2._8_8_ = local_138._8_8_;
    local_148 = paVar1;
  }
  local_100.field_2._M_allocated_capacity._1_7_ = local_138._M_allocated_capacity._1_7_;
  local_100.field_2._M_local_buf[0] = local_138._M_local_buf[0];
  local_140 = (_func_int **)0x0;
  local_138._M_local_buf[0] = '\0';
  if (local_128 == &local_118) {
    pp_Stack_c8 = pp_Stack_110;
    local_128 = &local_d0;
  }
  local_d0._vptr_TestFactoryBase._1_7_ = local_118._vptr_TestFactoryBase._1_7_;
  local_d0._vptr_TestFactoryBase._0_1_ = local_118._vptr_TestFactoryBase._0_1_;
  local_120 = (_func_int **)0x0;
  local_118._vptr_TestFactoryBase._0_1_ = 0;
  local_c0 = local_108;
  factory->_vptr_TestFactoryBase =
       (_func_int **)
       (
       _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal23InsertSyntheticTestCaseERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEENS2_12CodeLocationEE3__0EEPNS_8TestInfoEPKcSG_SG_SG_SG_iT0_E11FactoryImpl
       + 0x10);
  factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
  if (local_148 == paVar1) {
    factory[3]._vptr_TestFactoryBase = (_func_int **)local_100.field_2._M_allocated_capacity;
    factory[4]._vptr_TestFactoryBase = (_func_int **)local_100.field_2._8_8_;
  }
  else {
    factory[1]._vptr_TestFactoryBase = (_func_int **)local_148;
    factory[3]._vptr_TestFactoryBase = (_func_int **)local_100.field_2._M_allocated_capacity;
  }
  factory[2]._vptr_TestFactoryBase = pp_Var6;
  local_100._M_string_length = 0;
  local_100.field_2._M_allocated_capacity = (ulong)(uint7)local_138._M_allocated_capacity._1_7_ << 8
  ;
  factory[5]._vptr_TestFactoryBase = (_func_int **)(factory + 7);
  if (local_128 == &local_d0) {
    factory[7]._vptr_TestFactoryBase = local_d0._vptr_TestFactoryBase;
    factory[8]._vptr_TestFactoryBase = pp_Stack_c8;
  }
  else {
    factory[5]._vptr_TestFactoryBase = (_func_int **)local_128;
    factory[7]._vptr_TestFactoryBase = local_d0._vptr_TestFactoryBase;
  }
  factory[6]._vptr_TestFactoryBase = pp_Var7;
  local_d8 = 0;
  local_d0._vptr_TestFactoryBase = (_func_int **)((ulong)local_118._vptr_TestFactoryBase._1_7_ << 8)
  ;
  *(int *)&factory[9]._vptr_TestFactoryBase = local_108;
  local_148 = &local_138;
  local_128 = &local_118;
  local_100._M_dataplus._M_p = (pointer)paVar1;
  local_e0 = &local_d0;
  MakeAndRegisterTestInfo
            ("GoogleTestVerification",(char *)plVar8,(char *)0x0,(char *)0x0,&local_58,
             &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
             (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string &name, CodeLocation location) {
  std::string message =
      "Paramaterized test suite " + name +
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  std::string full_name = "UninstantiatedParamaterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}